

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall testing::Matcher<double>::Matcher(Matcher<double> *this,double value)

{
  linked_ptr<const_testing::MatcherInterface<double>_> local_30;
  
  (this->super_MatcherBase<double>).impl_.value_ = (MatcherInterface<double> *)0x0;
  (this->super_MatcherBase<double>).impl_.link_.next_ =
       &(this->super_MatcherBase<double>).impl_.link_;
  (this->super_MatcherBase<double>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d85c8;
  local_30.value_ = (MatcherInterface<double> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d87b8;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<double>_>::operator=
            (&(this->super_MatcherBase<double>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }